

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
cmListCommand::GetList
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,string *var)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmMakefile *this_00;
  bool bVar2;
  PolicyStatus PVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  PolicyID id;
  PolicyID id_00;
  string warn;
  string listString;
  
  listString._M_dataplus._M_p = (pointer)&listString.field_2;
  listString._M_string_length = 0;
  listString.field_2._M_local_buf[0] = '\0';
  bVar2 = GetListString(this,&listString,var);
  if (bVar2) {
    bVar2 = true;
    if (listString._M_string_length == 0) goto LAB_001ef771;
    cmSystemTools::ExpandListArgument(&listString,list,true);
    warn._M_dataplus._M_p = (pointer)&warn.field_2;
    warn._M_string_length = 0;
    warn.field_2._M_local_buf[0] = '\0';
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((list->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (list->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,&warn);
    pbVar1 = (list->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::~string((string *)&warn);
    if (_Var4._M_current == pbVar1) goto LAB_001ef771;
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0007,false);
    if (1 < PVar3 - REQUIRED_IF_USED) {
      if (PVar3 == OLD) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(list);
        cmSystemTools::ExpandListArgument(&listString,list,false);
      }
      else if (PVar3 == WARN) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(list);
        cmSystemTools::ExpandListArgument(&listString,list,false);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&warn,(cmPolicies *)0x7,id_00);
        std::__cxx11::string::append((char *)&warn);
        std::__cxx11::string::append((string *)&warn);
        std::__cxx11::string::append((char *)&warn);
        cmMakefile::IssueMessage((this->super_cmCommand).Makefile,AUTHOR_WARNING,&warn);
        std::__cxx11::string::~string((string *)&warn);
      }
      goto LAB_001ef771;
    }
    this_00 = (this->super_cmCommand).Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&warn,(cmPolicies *)0x7,id);
    cmMakefile::IssueMessage(this_00,FATAL_ERROR,&warn);
    std::__cxx11::string::~string((string *)&warn);
  }
  bVar2 = false;
LAB_001ef771:
  std::__cxx11::string::~string((string *)&listString);
  return bVar2;
}

Assistant:

bool cmListCommand::GetList(std::vector<std::string>& list,
                            const std::string& var)
{
  std::string listString;
  if (!this->GetListString(listString, var)) {
    return false;
  }
  // if the size of the list
  if (listString.empty()) {
    return true;
  }
  // expand the variable into a list
  cmSystemTools::ExpandListArgument(listString, list, true);
  // if no empty elements then just return
  if (std::find(list.begin(), list.end(), std::string()) == list.end()) {
    return true;
  }
  // if we have empty elements we need to check policy CMP0007
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0007)) {
    case cmPolicies::WARN: {
      // Default is to warn and use old behavior
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list.clear();
      cmSystemTools::ExpandListArgument(listString, list);
      std::string warn = cmPolicies::GetPolicyWarning(cmPolicies::CMP0007);
      warn += " List has value = [";
      warn += listString;
      warn += "].";
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, warn);
      return true;
    }
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list.clear();
      cmSystemTools::ExpandListArgument(listString, list);
      return true;
    case cmPolicies::NEW:
      return true;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0007));
      return false;
  }
  return true;
}